

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O0

void __thiscall
JsUtil::
BaseDictionary<unsigned_char,_IR::Opnd_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::Clear(BaseDictionary<unsigned_char,_IR::Opnd_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        *this)

{
  char *name;
  DictionaryStats *pDVar1;
  BaseDictionary<unsigned_char,_IR::Opnd_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_local;
  
  if (0 < this->count) {
    memset(this->buckets,0xff,(ulong)this->bucketCount << 2);
    memset(this->entries,0,(long)this->size << 4);
    this->count = 0;
    this->freeCount = 0;
    name = std::type_info::name
                     ((type_info *)
                      &BaseDictionary<unsigned_char,IR::Opnd*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>*
                       ::typeinfo);
    pDVar1 = DictionaryStats::Create(name,this->size);
    this->stats = pDVar1;
  }
  return;
}

Assistant:

void Clear()
        {
            if (count > 0)
            {
                memset(buckets, -1, bucketCount * sizeof(buckets[0]));
                memset(entries, 0, sizeof(EntryType) * size);
                count = 0;
                freeCount = 0;
#if PROFILE_DICTIONARY
                // To not loose previously collected data, we will treat cleared dictionary as a separate instance for stats tracking purpose
                stats = DictionaryStats::Create(typeid(this).name(), size);
#endif
            }
        }